

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

int run_test_fs_fstat(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  __uid_t _Var2;
  int extraout_EAX_02;
  uv_loop_t *puVar3;
  int **ppiVar4;
  undefined8 uVar5;
  uv_loop_t *puVar6;
  void *pvVar7;
  char *pcVar8;
  int **ppiVar9;
  int **ppiVar10;
  undefined8 *puVar11;
  uv_loop_t *puVar12;
  char *pcVar13;
  undefined8 *puVar14;
  char *pcVar15;
  int **unaff_R14;
  int **ppiVar16;
  int **ppiVar17;
  int **ppiVar18;
  uv_buf_t uVar19;
  stat t;
  uv_fs_t req;
  undefined1 auStack_f50 [88];
  long lStack_ef8;
  long lStack_ef0;
  code *pcStack_d98;
  code *pcStack_d90;
  undefined8 uStack_d88;
  char acStack_d78 [88];
  char *pcStack_d20;
  uv_loop_t *puStack_bc0;
  int **ppiStack_bb8;
  code *pcStack_bb0;
  code *pcStack_ba8;
  uv_loop_t *puStack_ba0;
  code *pcStack_b98;
  int *apiStack_b90 [11];
  uv_loop_t *puStack_b38;
  int **ppiStack_9d8;
  int **ppiStack_9d0;
  undefined8 uStack_9c8;
  int *apiStack_9b8 [11];
  int **ppiStack_960;
  undefined8 *puStack_800;
  int **ppiStack_7f8;
  code *pcStack_7f0;
  code *pcStack_7e8;
  undefined1 auStack_7d8 [88];
  long lStack_780;
  uint uStack_760;
  code *pcStack_620;
  undefined8 uStack_618;
  int *apiStack_610 [11];
  char *pcStack_5b8;
  char *pcStack_458;
  int **ppiStack_450;
  int *apiStack_438 [11];
  char *pcStack_3e0;
  char *pcStack_280;
  int **ppiStack_278;
  code *pcStack_270;
  undefined8 local_268;
  stat64 local_258;
  int *local_1c8 [11];
  char *local_170;
  int **local_168;
  undefined1 local_158 [328];
  
  pcVar8 = "test_file";
  pcStack_270 = (code *)0x154786;
  unlink("test_file");
  pcStack_270 = (code *)0x15478b;
  loop = (uv_loop_t *)uv_default_loop();
  puVar3 = (uv_loop_t *)0x0;
  pcStack_270 = (code *)0x1547b2;
  iVar1 = uv_fs_open(0,local_1c8,"test_file",0x42,0x180,0);
  pcVar13 = local_170;
  if (iVar1 < 0) {
    pcStack_270 = (code *)0x154b17;
    run_test_fs_fstat_cold_1();
LAB_00154b17:
    pcStack_270 = (code *)0x154b1c;
    run_test_fs_fstat_cold_2();
LAB_00154b1c:
    pcStack_270 = (code *)0x154b21;
    run_test_fs_fstat_cold_3();
LAB_00154b21:
    pcStack_270 = (code *)0x154b26;
    run_test_fs_fstat_cold_4();
LAB_00154b26:
    pcStack_270 = (code *)0x154b2b;
    run_test_fs_fstat_cold_5();
LAB_00154b2b:
    pcStack_270 = (code *)0x154b30;
    run_test_fs_fstat_cold_6();
LAB_00154b30:
    pcStack_270 = (code *)0x154b35;
    run_test_fs_fstat_cold_7();
LAB_00154b35:
    pcStack_270 = (code *)0x154b3a;
    run_test_fs_fstat_cold_8();
LAB_00154b3a:
    pcStack_270 = (code *)0x154b3f;
    run_test_fs_fstat_cold_9();
LAB_00154b3f:
    pcStack_270 = (code *)0x154b44;
    run_test_fs_fstat_cold_10();
LAB_00154b44:
    pcStack_270 = (code *)0x154b49;
    run_test_fs_fstat_cold_11();
LAB_00154b49:
    pcStack_270 = (code *)0x154b4e;
    run_test_fs_fstat_cold_12();
LAB_00154b4e:
    pcStack_270 = (code *)0x154b53;
    run_test_fs_fstat_cold_13();
LAB_00154b53:
    pcStack_270 = (code *)0x154b58;
    run_test_fs_fstat_cold_14();
LAB_00154b58:
    pcStack_270 = (code *)0x154b5d;
    run_test_fs_fstat_cold_15();
LAB_00154b5d:
    pcStack_270 = (code *)0x154b62;
    run_test_fs_fstat_cold_16();
LAB_00154b62:
    pcStack_270 = (code *)0x154b67;
    run_test_fs_fstat_cold_17();
LAB_00154b67:
    pcStack_270 = (code *)0x154b6c;
    run_test_fs_fstat_cold_18();
LAB_00154b6c:
    pcStack_270 = (code *)0x154b71;
    run_test_fs_fstat_cold_19();
LAB_00154b71:
    pcStack_270 = (code *)0x154b76;
    run_test_fs_fstat_cold_20();
LAB_00154b76:
    pcStack_270 = (code *)0x154b7b;
    run_test_fs_fstat_cold_21();
LAB_00154b7b:
    pcStack_270 = (code *)0x154b80;
    run_test_fs_fstat_cold_22();
LAB_00154b80:
    pcStack_270 = (code *)0x154b85;
    run_test_fs_fstat_cold_23();
LAB_00154b85:
    pcStack_270 = (code *)0x154b8a;
    run_test_fs_fstat_cold_24();
LAB_00154b8a:
    pcStack_270 = (code *)0x154b8f;
    run_test_fs_fstat_cold_25();
LAB_00154b8f:
    pcStack_270 = (code *)0x154b94;
    run_test_fs_fstat_cold_26();
LAB_00154b94:
    pcStack_270 = (code *)0x154b99;
    run_test_fs_fstat_cold_27();
LAB_00154b99:
    pcStack_270 = (code *)0x154b9e;
    run_test_fs_fstat_cold_28();
LAB_00154b9e:
    pcStack_270 = (code *)0x154ba3;
    run_test_fs_fstat_cold_29();
LAB_00154ba3:
    pcStack_270 = (code *)0x154ba8;
    run_test_fs_fstat_cold_30();
LAB_00154ba8:
    pcStack_270 = (code *)0x154bad;
    run_test_fs_fstat_cold_31();
LAB_00154bad:
    pcStack_270 = (code *)0x154bb2;
    run_test_fs_fstat_cold_32();
LAB_00154bb2:
    pcStack_270 = (code *)0x154bb7;
    run_test_fs_fstat_cold_33();
LAB_00154bb7:
    pcStack_270 = (code *)0x154bbc;
    run_test_fs_fstat_cold_34();
LAB_00154bbc:
    pcStack_270 = (code *)0x154bc1;
    run_test_fs_fstat_cold_35();
  }
  else {
    pcVar8 = local_170;
    if ((long)local_170 < 0) goto LAB_00154b17;
    pcStack_270 = (code *)0x1547d8;
    uv_fs_req_cleanup(local_1c8);
    puVar3 = (uv_loop_t *)((ulong)pcVar13 & 0xffffffff);
    pcStack_270 = (code *)0x1547e4;
    iVar1 = fstat64((int)pcVar13,&local_258);
    pcVar8 = pcVar13;
    if (iVar1 != 0) goto LAB_00154b1c;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x1547ff;
    iVar1 = uv_fs_fstat(0,local_1c8,(ulong)pcVar13 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154b21;
    if (local_170 != (char *)0x0) goto LAB_00154b26;
    if ((local_168[0x12] != (int *)0x0) && (local_168[0x12] != (int *)local_258.st_ctim.tv_sec))
    goto LAB_00154b2b;
    if ((local_168[0x13] != (int *)0x0) && (local_168[0x13] != (int *)local_258.st_ctim.tv_nsec))
    goto LAB_00154b30;
    pcStack_270 = (code *)0x154860;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    local_268 = 0;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x15489b;
    iVar1 = uv_fs_write(0,local_1c8,(ulong)pcVar13 & 0xffffffff,&iov,1,0xffffffffffffffff);
    if (iVar1 != 0xd) goto LAB_00154b35;
    if (local_170 != (char *)0xd) goto LAB_00154b3a;
    unaff_R14 = local_1c8;
    pcStack_270 = (code *)0x1548c3;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_270 = (code *)0x1548da;
    memset(local_158,0xaa,0xa0);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x1548e8;
    iVar1 = uv_fs_fstat(0,unaff_R14,(ulong)pcVar13 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154b3f;
    if (local_170 != (char *)0x0) goto LAB_00154b44;
    unaff_R14 = local_168;
    if (local_168[7] != (int *)0xd) goto LAB_00154b49;
    puVar3 = (uv_loop_t *)((ulong)pcVar13 & 0xffffffff);
    pcStack_270 = (code *)0x15491e;
    iVar1 = fstat64((int)pcVar13,&local_258);
    if (iVar1 != 0) goto LAB_00154b4e;
    if (*local_168 != (int *)local_258.st_dev) goto LAB_00154b53;
    if (local_168[1] != (int *)(ulong)local_258.st_mode) goto LAB_00154b58;
    if (local_168[2] != (int *)local_258.st_nlink) goto LAB_00154b5d;
    if (local_168[3] != (int *)(ulong)local_258.st_uid) goto LAB_00154b62;
    if (local_168[4] != (int *)(ulong)local_258.st_gid) goto LAB_00154b67;
    if (local_168[5] != (int *)local_258.st_rdev) goto LAB_00154b6c;
    if (local_168[6] != (int *)local_258.st_ino) goto LAB_00154b71;
    if (local_168[7] != (int *)local_258.st_size) goto LAB_00154b76;
    if (local_168[8] != (int *)local_258.st_blksize) goto LAB_00154b7b;
    if (local_168[9] != (int *)local_258.st_blocks) goto LAB_00154b80;
    if (local_168[0xc] != (int *)local_258.st_atim.tv_sec) goto LAB_00154b85;
    if (local_168[0xd] != (int *)local_258.st_atim.tv_nsec) goto LAB_00154b8a;
    if (local_168[0xe] != (int *)local_258.st_mtim.tv_sec) goto LAB_00154b8f;
    if (local_168[0xf] != (int *)local_258.st_mtim.tv_nsec) goto LAB_00154b94;
    if (local_168[0x10] != (int *)local_258.st_ctim.tv_sec) goto LAB_00154b99;
    if (local_168[0x11] != (int *)local_258.st_ctim.tv_nsec) goto LAB_00154b9e;
    if (local_168[10] != (int *)0x0) goto LAB_00154ba3;
    if (local_168[0xb] != (int *)0x0) goto LAB_00154ba8;
    unaff_R14 = local_1c8;
    pcStack_270 = (code *)0x154a41;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_270 = (code *)0x154a59;
    puVar3 = loop;
    iVar1 = uv_fs_fstat(loop,unaff_R14,(ulong)pcVar13 & 0xffffffff,fstat_cb);
    if (iVar1 != 0) goto LAB_00154bad;
    pcStack_270 = (code *)0x154a6f;
    puVar3 = loop;
    uv_run(loop,0);
    if (fstat_cb_count != 1) goto LAB_00154bb2;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_270 = (code *)0x154a8f;
    iVar1 = uv_fs_close(0,local_1c8,(ulong)pcVar13 & 0xffffffff,0);
    if (iVar1 != 0) goto LAB_00154bb7;
    if (local_170 != (char *)0x0) goto LAB_00154bbc;
    pcStack_270 = (code *)0x154ab3;
    uv_fs_req_cleanup(local_1c8);
    pcStack_270 = (code *)0x154ac1;
    uv_run(loop,0);
    pcStack_270 = (code *)0x154acd;
    unlink("test_file");
    pcStack_270 = (code *)0x154ad2;
    pcVar8 = (char *)uv_default_loop();
    pcStack_270 = (code *)0x154ae6;
    uv_walk(pcVar8,close_walk_cb,0);
    pcStack_270 = (code *)0x154af0;
    uv_run(pcVar8,0);
    pcStack_270 = (code *)0x154af5;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_270 = (code *)0x154afd;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_270 = fstat_cb;
  run_test_fs_fstat_cold_36();
  if (puVar3->backend_fd == 8) {
    if (puVar3->watcher_queue[0] != (void *)0x0) goto LAB_00154bf1;
    if (*(long *)((long)puVar3->watcher_queue[1] + 0x38) == 0xd) {
      ppiStack_278 = (int **)0x154be4;
      pcStack_270._0_4_ = extraout_EAX;
      uv_fs_req_cleanup();
      fstat_cb_count = fstat_cb_count + 1;
      return (int)pcStack_270;
    }
  }
  else {
    ppiStack_278 = (int **)0x154bf1;
    fstat_cb_cold_1();
LAB_00154bf1:
    ppiStack_278 = (int **)0x154bf6;
    fstat_cb_cold_2();
  }
  ppiStack_278 = (int **)run_test_fs_access;
  fstat_cb_cold_3();
  ppiVar16 = apiStack_438;
  ppiVar4 = apiStack_438;
  ppiVar9 = (int **)0x184395;
  pcStack_280 = pcVar8;
  ppiStack_278 = unaff_R14;
  unlink("test_file");
  rmdir("test_dir");
  loop = (uv_loop_t *)uv_default_loop();
  puVar3 = (uv_loop_t *)0x0;
  iVar1 = uv_fs_access(0,apiStack_438,"test_file",0,0);
  if (iVar1 < 0) {
    if (-1 < (long)pcStack_3e0) goto LAB_00154e64;
    uv_fs_req_cleanup(apiStack_438);
    puVar3 = loop;
    iVar1 = uv_fs_access(loop,apiStack_438,"test_file",0,access_cb);
    ppiVar9 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154e69;
    puVar3 = loop;
    uv_run(loop,0);
    ppiVar9 = apiStack_438;
    if (access_cb_count != 1) goto LAB_00154e6e;
    access_cb_count = 0;
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_open(0,apiStack_438,"test_file",0x42,0x180,0);
    ppiVar10 = (int **)pcStack_3e0;
    ppiVar9 = apiStack_438;
    if (iVar1 < 0) goto LAB_00154e73;
    if ((long)pcStack_3e0 < 0) goto LAB_00154e78;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_438,"test_file",0,0);
    unaff_R14 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154e7d;
    unaff_R14 = apiStack_438;
    if (pcStack_3e0 != (char *)0x0) goto LAB_00154e82;
    uv_fs_req_cleanup(apiStack_438);
    puVar3 = loop;
    iVar1 = uv_fs_access(loop,apiStack_438,"test_file",0,access_cb);
    if (iVar1 != 0) goto LAB_00154e87;
    puVar3 = loop;
    uv_run(loop,0);
    ppiVar16 = apiStack_438;
    if (access_cb_count != 1) goto LAB_00154e8c;
    access_cb_count = 0;
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_close(0,apiStack_438,(ulong)ppiVar10 & 0xffffffff,0);
    ppiVar16 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154e91;
    ppiVar16 = apiStack_438;
    if (pcStack_3e0 != (char *)0x0) goto LAB_00154e96;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_mkdir(0,apiStack_438,"test_dir",0x1ff,0);
    ppiVar10 = apiStack_438;
    ppiVar16 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154e9b;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    iVar1 = uv_fs_access(0,apiStack_438,"test_dir",2,0);
    ppiVar16 = apiStack_438;
    if (iVar1 != 0) goto LAB_00154ea0;
    ppiVar4 = apiStack_438;
    ppiVar16 = apiStack_438;
    if (pcStack_3e0 != (char *)0x0) goto LAB_00154ea5;
    uv_fs_req_cleanup(apiStack_438);
    uv_run(loop,0);
    unlink("test_file");
    rmdir("test_dir");
    ppiVar4 = (int **)uv_default_loop();
    uv_walk(ppiVar4,close_walk_cb,0);
    uv_run(ppiVar4,0);
    puVar3 = (uv_loop_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    ppiVar16 = apiStack_438;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_access_cold_1();
LAB_00154e64:
    run_test_fs_access_cold_2();
LAB_00154e69:
    run_test_fs_access_cold_3();
LAB_00154e6e:
    run_test_fs_access_cold_4();
LAB_00154e73:
    ppiVar10 = ppiVar9;
    run_test_fs_access_cold_5();
LAB_00154e78:
    run_test_fs_access_cold_6();
LAB_00154e7d:
    run_test_fs_access_cold_7();
LAB_00154e82:
    ppiVar16 = unaff_R14;
    run_test_fs_access_cold_8();
LAB_00154e87:
    run_test_fs_access_cold_9();
LAB_00154e8c:
    run_test_fs_access_cold_10();
LAB_00154e91:
    run_test_fs_access_cold_11();
LAB_00154e96:
    run_test_fs_access_cold_12();
LAB_00154e9b:
    ppiVar4 = ppiVar10;
    run_test_fs_access_cold_13();
LAB_00154ea0:
    run_test_fs_access_cold_14();
LAB_00154ea5:
    run_test_fs_access_cold_15();
  }
  run_test_fs_access_cold_16();
  if (puVar3->backend_fd == 0xc) {
    access_cb_count = access_cb_count + 1;
    iVar1 = uv_fs_req_cleanup();
    return iVar1;
  }
  access_cb_cold_1();
  pcVar8 = "test_file";
  pcStack_620 = (code *)0x154ee1;
  pcStack_458 = (char *)ppiVar4;
  ppiStack_450 = ppiVar16;
  unlink("test_file");
  pcStack_620 = (code *)0x154ee6;
  loop = (uv_loop_t *)uv_default_loop();
  ppiVar4 = apiStack_610;
  puVar3 = (uv_loop_t *)0x0;
  pcStack_620 = (code *)0x154f0a;
  iVar1 = uv_fs_open(0,ppiVar4,"test_file",0x42,0x180,0);
  pcVar13 = pcStack_5b8;
  if (iVar1 < 0) {
    pcStack_620 = (code *)0x1551dd;
    run_test_fs_chmod_cold_1();
LAB_001551dd:
    pcStack_620 = (code *)0x1551e2;
    run_test_fs_chmod_cold_2();
LAB_001551e2:
    pcStack_620 = (code *)0x1551e7;
    run_test_fs_chmod_cold_3();
LAB_001551e7:
    pcStack_620 = (code *)0x1551ec;
    run_test_fs_chmod_cold_4();
LAB_001551ec:
    pcStack_620 = (code *)0x1551f1;
    run_test_fs_chmod_cold_5();
LAB_001551f1:
    pcStack_620 = (code *)0x1551f6;
    run_test_fs_chmod_cold_6();
LAB_001551f6:
    pcStack_620 = (code *)0x1551fb;
    run_test_fs_chmod_cold_7();
LAB_001551fb:
    pcStack_620 = (code *)0x155200;
    run_test_fs_chmod_cold_8();
LAB_00155200:
    pcStack_620 = (code *)0x155205;
    run_test_fs_chmod_cold_9();
LAB_00155205:
    pcStack_620 = (code *)0x15520a;
    run_test_fs_chmod_cold_10();
LAB_0015520a:
    pcStack_620 = (code *)0x15520f;
    run_test_fs_chmod_cold_11();
LAB_0015520f:
    pcStack_620 = (code *)0x155214;
    run_test_fs_chmod_cold_12();
LAB_00155214:
    pcStack_620 = (code *)0x155219;
    run_test_fs_chmod_cold_13();
LAB_00155219:
    pcStack_620 = (code *)0x15521e;
    run_test_fs_chmod_cold_14();
LAB_0015521e:
    pcStack_620 = (code *)0x155223;
    run_test_fs_chmod_cold_15();
LAB_00155223:
    pcStack_620 = (code *)0x155228;
    run_test_fs_chmod_cold_16();
  }
  else {
    pcVar8 = pcStack_5b8;
    if ((long)pcStack_5b8 < 0) goto LAB_001551dd;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x154f2d;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x154f3e;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_618 = 0;
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x154f74;
    ppiVar4 = ppiVar16;
    iov = uVar19;
    iVar1 = uv_fs_write(0,ppiVar16,(ulong)pcVar13 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar8 = pcVar13;
    if (iVar1 != 0xd) goto LAB_001551e2;
    if (pcStack_5b8 != (char *)0xd) goto LAB_001551e7;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x154f96;
    uv_fs_req_cleanup();
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x154faf;
    ppiVar4 = ppiVar16;
    iVar1 = uv_fs_chmod(0,ppiVar16,"test_file",0x80,0);
    if (iVar1 != 0) goto LAB_001551ec;
    if (pcStack_5b8 != (char *)0x0) goto LAB_001551f1;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x154fd0;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x154fe4;
    check_permission("test_file",0x80);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x154ff9;
    ppiVar4 = ppiVar16;
    iVar1 = uv_fs_chmod(0,ppiVar16,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001551f6;
    if (pcStack_5b8 != (char *)0x0) goto LAB_001551fb;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x15501a;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x15502b;
    check_permission("test_file",0x100);
    puVar3 = (uv_loop_t *)0x0;
    pcStack_620 = (code *)0x15503f;
    ppiVar4 = ppiVar16;
    iVar1 = uv_fs_fchmod(0,ppiVar16,(ulong)pcVar13 & 0xffffffff,0x180,0);
    if (iVar1 != 0) goto LAB_00155200;
    if (pcStack_5b8 != (char *)0x0) goto LAB_00155205;
    ppiVar16 = apiStack_610;
    pcStack_620 = (code *)0x155060;
    uv_fs_req_cleanup(ppiVar16);
    pcStack_620 = (code *)0x155074;
    check_permission("test_file",0x180);
    apiStack_610[0] = &run_test_fs_chmod::mode;
    pcStack_620 = (code *)0x15509c;
    ppiVar4 = ppiVar16;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar16,"test_file",0x80,chmod_cb);
    if (iVar1 != 0) goto LAB_0015520a;
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x1550b2;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_0015520f;
    chmod_cb_count = 0;
    ppiVar4 = apiStack_610;
    apiStack_610[0] = &run_test_fs_chmod::mode_1;
    pcStack_620 = (code *)0x1550f7;
    puVar3 = loop;
    iVar1 = uv_fs_chmod(loop,ppiVar4,"test_file",0x100,chmod_cb);
    if (iVar1 != 0) goto LAB_00155214;
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x15510d;
    puVar3 = loop;
    uv_run();
    if (chmod_cb_count != 1) goto LAB_00155219;
    ppiVar4 = apiStack_610;
    apiStack_610[0] = &run_test_fs_chmod::mode_2;
    pcStack_620 = (code *)0x155143;
    puVar3 = loop;
    iVar1 = uv_fs_fchmod(loop,ppiVar4,(ulong)pcVar13 & 0xffffffff,0x180,fchmod_cb);
    if (iVar1 != 0) goto LAB_0015521e;
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x155159;
    puVar3 = loop;
    uv_run();
    if (fchmod_cb_count != 1) goto LAB_00155223;
    pcStack_620 = (code *)0x15517b;
    uv_fs_close(loop,apiStack_610,(ulong)pcVar13 & 0xffffffff,0);
    pcStack_620 = (code *)0x155189;
    uv_run(loop,0);
    pcStack_620 = (code *)0x155195;
    unlink("test_file");
    pcStack_620 = (code *)0x15519a;
    pcVar8 = (char *)uv_default_loop();
    pcStack_620 = (code *)0x1551ae;
    uv_walk(pcVar8,close_walk_cb,0);
    ppiVar4 = (int **)0x0;
    pcStack_620 = (code *)0x1551b8;
    uv_run(pcVar8);
    pcStack_620 = (code *)0x1551bd;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_620 = (code *)0x1551c5;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_620 = check_permission;
  run_test_fs_chmod_cold_17();
  puVar11 = (undefined8 *)((ulong)ppiVar4 & 0xffffffff);
  puVar14 = (undefined8 *)0x0;
  pcStack_7e8 = (code *)0x155248;
  pcStack_620 = (code *)pcVar8;
  iVar1 = uv_fs_stat(0,auStack_7d8,puVar3,0);
  if (iVar1 == 0) {
    if (lStack_780 != 0) goto LAB_0015527c;
    if ((uStack_760 & 0x1ff) == (uint)ppiVar4) {
      pcStack_7e8 = (code *)0x15526e;
      iVar1 = uv_fs_req_cleanup(auStack_7d8);
      return iVar1;
    }
  }
  else {
    pcStack_7e8 = (code *)0x15527c;
    check_permission_cold_1();
LAB_0015527c:
    pcStack_7e8 = (code *)0x155281;
    check_permission_cold_2();
  }
  pcStack_7e8 = chmod_cb;
  check_permission_cold_3();
  pcStack_7e8 = (code *)puVar11;
  if (*(int *)(puVar14 + 8) == 0xd) {
    puVar11 = puVar14;
    if (puVar14[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      pcStack_7f0 = (code *)0x1552a5;
      uv_fs_req_cleanup(puVar14);
      check_permission("test_file",*(uint *)*puVar14);
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_7f0 = (code *)0x1552bc;
    chmod_cb_cold_1();
  }
  pcStack_7f0 = fchmod_cb;
  chmod_cb_cold_2();
  pcStack_7f0 = (code *)puVar11;
  if (*(int *)(puVar14 + 8) == 0xe) {
    puStack_800 = puVar14;
    if (puVar14[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      ppiStack_7f8 = (int **)0x1552e0;
      uv_fs_req_cleanup(puVar14);
      check_permission("test_file",*(uint *)*puVar14);
      return extraout_EAX_01;
    }
  }
  else {
    ppiStack_7f8 = (int **)0x1552f7;
    fchmod_cb_cold_1();
    puStack_800 = puVar11;
  }
  ppiStack_7f8 = (int **)run_test_fs_unlink_readonly;
  fchmod_cb_cold_2();
  ppiVar4 = (int **)0x184395;
  ppiStack_9d0 = (int **)0x155315;
  ppiStack_7f8 = ppiVar16;
  unlink("test_file");
  ppiStack_9d0 = (int **)0x15531a;
  loop = (uv_loop_t *)uv_default_loop();
  ppiStack_9d0 = (int **)0x15533e;
  iVar1 = uv_fs_open(0,apiStack_9b8,"test_file",0x42,0x180,0);
  ppiVar9 = ppiStack_960;
  if (iVar1 < 0) {
    ppiStack_9d0 = (int **)0x1554db;
    run_test_fs_unlink_readonly_cold_1();
LAB_001554db:
    ppiStack_9d0 = (int **)0x1554e0;
    run_test_fs_unlink_readonly_cold_2();
LAB_001554e0:
    ppiStack_9d0 = (int **)0x1554e5;
    run_test_fs_unlink_readonly_cold_3();
LAB_001554e5:
    ppiStack_9d0 = (int **)0x1554ea;
    run_test_fs_unlink_readonly_cold_4();
LAB_001554ea:
    ppiStack_9d0 = (int **)0x1554ef;
    run_test_fs_unlink_readonly_cold_5();
LAB_001554ef:
    ppiStack_9d0 = (int **)0x1554f4;
    run_test_fs_unlink_readonly_cold_6();
LAB_001554f4:
    ppiStack_9d0 = (int **)0x1554f9;
    run_test_fs_unlink_readonly_cold_7();
LAB_001554f9:
    ppiStack_9d0 = (int **)0x1554fe;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    ppiVar4 = ppiStack_960;
    if ((long)ppiStack_960 < 0) goto LAB_001554db;
    ppiVar16 = apiStack_9b8;
    ppiStack_9d0 = (int **)0x155361;
    uv_fs_req_cleanup(ppiVar16);
    ppiStack_9d0 = (int **)0x155372;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_9c8 = 0;
    ppiStack_9d0 = (int **)0x1553a8;
    iov = uVar19;
    iVar1 = uv_fs_write(0,ppiVar16,(ulong)ppiVar9 & 0xffffffff,&iov,1,0xffffffffffffffff);
    ppiVar4 = ppiVar9;
    if (iVar1 != 0xd) goto LAB_001554e0;
    if (ppiStack_960 != (int **)0xd) goto LAB_001554e5;
    ppiVar16 = apiStack_9b8;
    ppiStack_9d0 = (int **)0x1553ca;
    uv_fs_req_cleanup(ppiVar16);
    ppiStack_9d0 = (int **)0x1553dd;
    uv_fs_close(loop,ppiVar16,(ulong)ppiVar9 & 0xffffffff,0);
    ppiStack_9d0 = (int **)0x1553f6;
    iVar1 = uv_fs_chmod(0,ppiVar16,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001554ea;
    if (ppiStack_960 != (int **)0x0) goto LAB_001554ef;
    ppiVar4 = apiStack_9b8;
    ppiStack_9d0 = (int **)0x155417;
    uv_fs_req_cleanup(ppiVar4);
    ppiVar16 = (int **)0x184395;
    ppiStack_9d0 = (int **)0x15542b;
    check_permission("test_file",0x100);
    ppiStack_9d0 = (int **)0x15543a;
    iVar1 = uv_fs_unlink(0,ppiVar4,"test_file",0);
    if (iVar1 != 0) goto LAB_001554f4;
    if (ppiStack_960 != (int **)0x0) goto LAB_001554f9;
    ppiStack_9d0 = (int **)0x15545b;
    uv_fs_req_cleanup(apiStack_9b8);
    ppiStack_9d0 = (int **)0x155469;
    uv_run(loop,0);
    ppiVar16 = (int **)0x184395;
    ppiStack_9d0 = (int **)0x155485;
    uv_fs_chmod(0,apiStack_9b8,"test_file",0x180,0);
    ppiStack_9d0 = (int **)0x15548d;
    uv_fs_req_cleanup(apiStack_9b8);
    ppiStack_9d0 = (int **)0x155495;
    unlink("test_file");
    ppiStack_9d0 = (int **)0x15549a;
    ppiVar4 = (int **)uv_default_loop();
    ppiStack_9d0 = (int **)0x1554ae;
    uv_walk(ppiVar4,close_walk_cb,0);
    ppiStack_9d0 = (int **)0x1554b8;
    uv_run(ppiVar4,0);
    ppiStack_9d0 = (int **)0x1554bd;
    uVar5 = uv_default_loop();
    ppiStack_9d0 = (int **)0x1554c5;
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  ppiStack_9d0 = (int **)run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  ppiVar17 = apiStack_b90;
  ppiVar18 = apiStack_b90;
  ppiVar10 = apiStack_b90;
  ppiVar9 = apiStack_b90;
  puVar12 = (uv_loop_t *)0x184395;
  pcStack_b98 = (code *)0x15551c;
  ppiStack_9d8 = ppiVar4;
  ppiStack_9d0 = ppiVar16;
  unlink("test_file");
  pcStack_b98 = (code *)0x155528;
  unlink("test_file_link");
  pcStack_b98 = (code *)0x15552d;
  loop = (uv_loop_t *)uv_default_loop();
  puVar6 = (uv_loop_t *)0x0;
  pcStack_b98 = (code *)0x15554f;
  iVar1 = uv_fs_open(0,apiStack_b90,"test_file",0x42,0x180,0);
  puVar3 = puStack_b38;
  if (iVar1 < 0) {
    pcStack_b98 = (code *)0x155820;
    run_test_fs_chown_cold_1();
LAB_00155820:
    pcStack_b98 = (code *)0x155825;
    run_test_fs_chown_cold_2();
LAB_00155825:
    pcStack_b98 = (code *)0x15582a;
    run_test_fs_chown_cold_3();
LAB_0015582a:
    ppiVar17 = ppiVar16;
    pcStack_b98 = (code *)0x15582f;
    run_test_fs_chown_cold_4();
LAB_0015582f:
    pcStack_b98 = (code *)0x155834;
    run_test_fs_chown_cold_5();
LAB_00155834:
    ppiVar18 = ppiVar17;
    pcStack_b98 = (code *)0x155839;
    run_test_fs_chown_cold_6();
LAB_00155839:
    pcStack_b98 = (code *)0x15583e;
    run_test_fs_chown_cold_7();
LAB_0015583e:
    pcStack_b98 = (code *)0x155843;
    run_test_fs_chown_cold_8();
LAB_00155843:
    pcStack_b98 = (code *)0x155848;
    run_test_fs_chown_cold_9();
LAB_00155848:
    pcStack_b98 = (code *)0x15584d;
    run_test_fs_chown_cold_10();
LAB_0015584d:
    pcStack_b98 = (code *)0x155852;
    run_test_fs_chown_cold_11();
LAB_00155852:
    pcStack_b98 = (code *)0x155857;
    run_test_fs_chown_cold_12();
LAB_00155857:
    pcStack_b98 = (code *)0x15585c;
    run_test_fs_chown_cold_13();
LAB_0015585c:
    ppiVar10 = ppiVar18;
    pcStack_b98 = (code *)0x155861;
    run_test_fs_chown_cold_14();
LAB_00155861:
    pcStack_b98 = (code *)0x155866;
    run_test_fs_chown_cold_15();
LAB_00155866:
    ppiVar9 = ppiVar10;
    pcStack_b98 = (code *)0x15586b;
    run_test_fs_chown_cold_16();
LAB_0015586b:
    pcStack_b98 = (code *)0x155870;
    run_test_fs_chown_cold_17();
LAB_00155870:
    pcStack_b98 = (code *)0x155875;
    run_test_fs_chown_cold_18();
LAB_00155875:
    pcStack_b98 = (code *)0x15587a;
    run_test_fs_chown_cold_19();
LAB_0015587a:
    pcStack_b98 = (code *)0x15587f;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar12 = puStack_b38;
    if ((long)puStack_b38 < 0) goto LAB_00155820;
    pcStack_b98 = (code *)0x155570;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x15558f;
    iVar1 = uv_fs_chown(0,apiStack_b90,"test_file",0xffffffff,0xffffffff,0);
    puVar12 = puVar3;
    ppiVar16 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155825;
    ppiVar16 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_0015582a;
    pcStack_b98 = (code *)0x1555ae;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x1555c8;
    iVar1 = uv_fs_fchown(0,apiStack_b90,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015582f;
    ppiVar17 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_00155834;
    pcStack_b98 = (code *)0x1555e7;
    uv_fs_req_cleanup(apiStack_b90);
    pcStack_b98 = (code *)0x15560f;
    puVar6 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_b90,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155839;
    pcStack_b98 = (code *)0x155625;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar18 = apiStack_b90;
    if (chown_cb_count != 1) goto LAB_0015583e;
    chown_cb_count = 0;
    pcStack_b98 = (code *)0x15565e;
    puVar6 = loop;
    iVar1 = uv_fs_chown(loop,apiStack_b90,"test_file",0,0,chown_root_cb);
    ppiVar18 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155843;
    pcStack_b98 = (code *)0x155674;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar18 = apiStack_b90;
    if (chown_cb_count != 1) goto LAB_00155848;
    pcStack_b98 = (code *)0x1556a4;
    puVar6 = loop;
    iVar1 = uv_fs_fchown(loop,apiStack_b90,(ulong)puVar3 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    ppiVar18 = apiStack_b90;
    if (iVar1 != 0) goto LAB_0015584d;
    pcStack_b98 = (code *)0x1556ba;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar18 = apiStack_b90;
    if (fchown_cb_count != 1) goto LAB_00155852;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x1556e2;
    iVar1 = uv_fs_link(0,apiStack_b90,"test_file","test_file_link",0);
    ppiVar18 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155857;
    ppiVar18 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_0015585c;
    pcStack_b98 = (code *)0x155701;
    uv_fs_req_cleanup();
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x155720;
    iVar1 = uv_fs_lchown(0,apiStack_b90,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_00155861;
    ppiVar10 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_00155866;
    pcStack_b98 = (code *)0x15573f;
    uv_fs_req_cleanup(apiStack_b90);
    pcStack_b98 = (code *)0x155767;
    puVar6 = loop;
    iVar1 = uv_fs_lchown(loop,apiStack_b90,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_0015586b;
    pcStack_b98 = (code *)0x15577d;
    puVar6 = loop;
    uv_run(loop,0);
    ppiVar9 = apiStack_b90;
    if (lchown_cb_count != 1) goto LAB_00155870;
    puVar6 = (uv_loop_t *)0x0;
    pcStack_b98 = (code *)0x155798;
    iVar1 = uv_fs_close(0,apiStack_b90,(ulong)puVar3 & 0xffffffff,0);
    ppiVar9 = apiStack_b90;
    if (iVar1 != 0) goto LAB_00155875;
    ppiVar9 = apiStack_b90;
    if (puStack_b38 != (uv_loop_t *)0x0) goto LAB_0015587a;
    pcStack_b98 = (code *)0x1557b4;
    uv_fs_req_cleanup(apiStack_b90);
    pcStack_b98 = (code *)0x1557c2;
    uv_run(loop,0);
    pcStack_b98 = (code *)0x1557ce;
    unlink("test_file");
    pcStack_b98 = (code *)0x1557da;
    unlink("test_file_link");
    pcStack_b98 = (code *)0x1557df;
    puVar12 = (uv_loop_t *)uv_default_loop();
    pcStack_b98 = (code *)0x1557f3;
    uv_walk(puVar12,close_walk_cb,0);
    pcStack_b98 = (code *)0x1557fd;
    uv_run(puVar12,0);
    pcStack_b98 = (code *)0x155802;
    puVar6 = (uv_loop_t *)uv_default_loop();
    pcStack_b98 = (code *)0x15580a;
    iVar1 = uv_loop_close();
    ppiVar9 = apiStack_b90;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_b98 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar6->backend_fd == 0x1a) {
    if (puVar6->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    puStack_ba0 = (uv_loop_t *)0x1558a3;
    chown_cb_cold_1();
  }
  puStack_ba0 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_ba0 = puVar12;
  if (puVar6->backend_fd == 0x1a) {
    pcStack_ba8 = (code *)0x1558b7;
    puVar3 = puVar6;
    _Var2 = geteuid();
    pvVar7 = puVar6->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar7 == (void *)0xffffffffffffffff) goto LAB_001558cf;
      pcStack_ba8 = (code *)0x1558ca;
      chown_root_cb_cold_2();
    }
    puVar12 = puVar6;
    if (pvVar7 == (void *)0x0) {
LAB_001558cf:
      chown_cb_count = chown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup(puVar6);
      return iVar1;
    }
  }
  else {
    pcStack_ba8 = (code *)0x1558e3;
    chown_root_cb_cold_1();
    puVar3 = puVar6;
  }
  pcStack_ba8 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar3->backend_fd == 0x1b) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_bb0 = (code *)0x155907;
    fchown_cb_cold_1();
  }
  pcStack_bb0 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar3->backend_fd == 0x1e) {
    if (puVar3->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    ppiStack_bb8 = (int **)0x15592b;
    lchown_cb_cold_1();
  }
  ppiStack_bb8 = (int **)run_test_fs_link;
  lchown_cb_cold_2();
  pcVar8 = "test_file";
  pcStack_d90 = (code *)0x155949;
  puStack_bc0 = puVar12;
  ppiStack_bb8 = ppiVar9;
  unlink("test_file");
  pcStack_d90 = (code *)0x155955;
  unlink("test_file_link");
  pcStack_d90 = (code *)0x155961;
  unlink("test_file_link2");
  pcStack_d90 = (code *)0x155966;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar15 = (char *)0x0;
  pcStack_d90 = (code *)0x15598a;
  iVar1 = uv_fs_open(0,acStack_d78,"test_file",0x42,0x180,0);
  pcVar13 = pcStack_d20;
  if (iVar1 < 0) {
    pcStack_d90 = (code *)0x155cc8;
    run_test_fs_link_cold_1();
LAB_00155cc8:
    pcStack_d90 = (code *)0x155ccd;
    run_test_fs_link_cold_2();
LAB_00155ccd:
    pcStack_d90 = (code *)0x155cd2;
    run_test_fs_link_cold_3();
LAB_00155cd2:
    pcStack_d90 = (code *)0x155cd7;
    run_test_fs_link_cold_4();
LAB_00155cd7:
    pcStack_d90 = (code *)0x155cdc;
    run_test_fs_link_cold_5();
LAB_00155cdc:
    pcStack_d90 = (code *)0x155ce1;
    run_test_fs_link_cold_6();
LAB_00155ce1:
    pcVar13 = pcVar8;
    pcStack_d90 = (code *)0x155ce6;
    run_test_fs_link_cold_7();
LAB_00155ce6:
    pcStack_d90 = (code *)0x155ceb;
    run_test_fs_link_cold_8();
LAB_00155ceb:
    pcStack_d90 = (code *)0x155cf0;
    run_test_fs_link_cold_9();
LAB_00155cf0:
    pcStack_d90 = (code *)0x155cf5;
    run_test_fs_link_cold_10();
LAB_00155cf5:
    pcStack_d90 = (code *)0x155cfa;
    run_test_fs_link_cold_11();
LAB_00155cfa:
    pcStack_d90 = (code *)0x155cff;
    run_test_fs_link_cold_12();
LAB_00155cff:
    pcStack_d90 = (code *)0x155d04;
    run_test_fs_link_cold_13();
LAB_00155d04:
    pcVar8 = pcVar13;
    pcStack_d90 = (code *)0x155d09;
    run_test_fs_link_cold_14();
LAB_00155d09:
    pcStack_d90 = (code *)0x155d0e;
    run_test_fs_link_cold_15();
LAB_00155d0e:
    pcStack_d90 = (code *)0x155d13;
    run_test_fs_link_cold_16();
LAB_00155d13:
    pcStack_d90 = (code *)0x155d18;
    run_test_fs_link_cold_17();
LAB_00155d18:
    pcStack_d90 = (code *)0x155d1d;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar8 = pcStack_d20;
    if ((long)pcStack_d20 < 0) goto LAB_00155cc8;
    pcStack_d90 = (code *)0x1559ad;
    uv_fs_req_cleanup(acStack_d78);
    pcStack_d90 = (code *)0x1559be;
    uVar19 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_d88 = 0;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x1559f4;
    iov = uVar19;
    iVar1 = uv_fs_write(0,acStack_d78,(ulong)pcVar13 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar8 = pcVar13;
    if (iVar1 != 0xd) goto LAB_00155ccd;
    if (pcStack_d20 != (char *)0xd) goto LAB_00155cd2;
    pcStack_d90 = (code *)0x155a16;
    uv_fs_req_cleanup(acStack_d78);
    pcStack_d90 = (code *)0x155a29;
    uv_fs_close(loop,acStack_d78,(ulong)pcVar13 & 0xffffffff,0);
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155a44;
    iVar1 = uv_fs_link(0,acStack_d78,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155cd7;
    if (pcStack_d20 != (char *)0x0) goto LAB_00155cdc;
    pcStack_d90 = (code *)0x155a65;
    uv_fs_req_cleanup();
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155a81;
    iVar1 = uv_fs_open(0,acStack_d78,"test_file_link",2,0,0);
    pcVar13 = pcStack_d20;
    pcVar8 = acStack_d78;
    if (iVar1 < 0) goto LAB_00155ce1;
    if ((long)pcStack_d20 < 0) goto LAB_00155ce6;
    pcStack_d90 = (code *)0x155aa4;
    uv_fs_req_cleanup(acStack_d78);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_d90 = (code *)0x155ac6;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_d88 = 0;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155af8;
    iov = uVar19;
    iVar1 = uv_fs_read(0,acStack_d78,(ulong)pcVar13 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155ceb;
    if ((long)pcStack_d20 < 0) goto LAB_00155cf0;
    pcVar15 = buf;
    pcStack_d90 = (code *)0x155b1f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155cf5;
    pcStack_d90 = (code *)0x155b2e;
    close((int)pcVar13);
    pcStack_d90 = (code *)0x155b54;
    pcVar15 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_d78,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155cfa;
    pcStack_d90 = (code *)0x155b6a;
    pcVar15 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155cff;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155b95;
    iVar1 = uv_fs_open(0,acStack_d78,"test_file_link2",2,0,0);
    pcVar8 = pcStack_d20;
    if (iVar1 < 0) goto LAB_00155d04;
    if ((long)pcStack_d20 < 0) goto LAB_00155d09;
    pcStack_d90 = (code *)0x155bb8;
    uv_fs_req_cleanup(acStack_d78);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_d90 = (code *)0x155bda;
    uVar19 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_d88 = 0;
    pcVar15 = (char *)0x0;
    pcStack_d90 = (code *)0x155c0c;
    iov = uVar19;
    iVar1 = uv_fs_read(0,acStack_d78,(ulong)pcVar8 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155d0e;
    if ((long)pcStack_d20 < 0) goto LAB_00155d13;
    pcVar15 = buf;
    pcStack_d90 = (code *)0x155c33;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155d18;
    pcStack_d90 = (code *)0x155c50;
    uv_fs_close(loop,acStack_d78,(ulong)pcVar8 & 0xffffffff,0);
    pcStack_d90 = (code *)0x155c5e;
    uv_run(loop,0);
    pcStack_d90 = (code *)0x155c6a;
    unlink("test_file");
    pcStack_d90 = (code *)0x155c76;
    unlink("test_file_link");
    pcStack_d90 = (code *)0x155c82;
    unlink("test_file_link2");
    pcStack_d90 = (code *)0x155c87;
    pcVar8 = (char *)uv_default_loop();
    pcStack_d90 = (code *)0x155c9b;
    uv_walk(pcVar8,close_walk_cb,0);
    pcStack_d90 = (code *)0x155ca5;
    uv_run(pcVar8,0);
    pcStack_d90 = (code *)0x155caa;
    pcVar15 = (char *)uv_default_loop();
    pcStack_d90 = (code *)0x155cb2;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  pcStack_d90 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar15)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar15)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      iVar1 = uv_fs_req_cleanup();
      return iVar1;
    }
  }
  else {
    pcStack_d98 = (code *)0x155d41;
    link_cb_cold_1();
  }
  pcStack_d98 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_d98 = (code *)pcVar8;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_f50,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155e3b;
    if (dummy_cb_count != 1) goto LAB_00155e40;
    if (lStack_ef0 != 0) goto LAB_00155e45;
    if (lStack_ef8 != -2) goto LAB_00155e4a;
    uv_fs_req_cleanup(auStack_f50);
    iVar1 = uv_fs_readlink(0,auStack_f50,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155e4f;
    if (lStack_ef0 != 0) goto LAB_00155e54;
    if (lStack_ef8 == -2) {
      uv_fs_req_cleanup(auStack_f50);
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uv_run(uVar5,0);
      uVar5 = uv_default_loop();
      iVar1 = uv_loop_close(uVar5);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00155e5e;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155e3b:
    run_test_fs_readlink_cold_2();
LAB_00155e40:
    run_test_fs_readlink_cold_3();
LAB_00155e45:
    run_test_fs_readlink_cold_4();
LAB_00155e4a:
    run_test_fs_readlink_cold_5();
LAB_00155e4f:
    run_test_fs_readlink_cold_6();
LAB_00155e54:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155e5e:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(fs_fstat) {
  int r;
  uv_fs_t req;
  uv_file file;
  uv_stat_t* s;
#ifndef _WIN32
  struct stat t;
#endif

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

#ifndef _WIN32
  ASSERT(0 == fstat(file, &t));
  ASSERT(0 == uv_fs_fstat(NULL, &req, file, NULL));
  ASSERT(req.result == 0);
  s = req.ptr;
# if defined(__APPLE__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtimespec.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtimespec.tv_nsec);
# elif defined(__linux__)
  /* If statx() is supported, the birth time should be equal to the change time
   * because we just created the file. On older kernels, it's set to zero.
   */
  ASSERT(s->st_birthtim.tv_sec == 0 ||
         s->st_birthtim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == 0 ||
         s->st_birthtim.tv_nsec == t.st_ctim.tv_nsec);
# endif
#endif

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  memset(&req.statbuf, 0xaa, sizeof(req.statbuf));
  r = uv_fs_fstat(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  s = req.ptr;
  ASSERT(s->st_size == sizeof(test_buf));

#ifndef _WIN32
  r = fstat(file, &t);
  ASSERT(r == 0);

  ASSERT(s->st_dev == (uint64_t) t.st_dev);
  ASSERT(s->st_mode == (uint64_t) t.st_mode);
  ASSERT(s->st_nlink == (uint64_t) t.st_nlink);
  ASSERT(s->st_uid == (uint64_t) t.st_uid);
  ASSERT(s->st_gid == (uint64_t) t.st_gid);
  ASSERT(s->st_rdev == (uint64_t) t.st_rdev);
  ASSERT(s->st_ino == (uint64_t) t.st_ino);
  ASSERT(s->st_size == (uint64_t) t.st_size);
  ASSERT(s->st_blksize == (uint64_t) t.st_blksize);
  ASSERT(s->st_blocks == (uint64_t) t.st_blocks);
#if defined(__APPLE__)
  ASSERT(s->st_atim.tv_sec == t.st_atimespec.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atimespec.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtimespec.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimespec.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctimespec.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimespec.tv_nsec);
#elif defined(_AIX)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#elif defined(__ANDROID__)
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == t.st_atimensec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtimensec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctimensec);
#elif defined(__sun)           || \
      defined(__DragonFly__)   || \
      defined(__FreeBSD__)     || \
      defined(__OpenBSD__)     || \
      defined(__NetBSD__)      || \
      defined(_GNU_SOURCE)     || \
      defined(_BSD_SOURCE)     || \
      defined(_SVID_SOURCE)    || \
      defined(_XOPEN_SOURCE)   || \
      defined(_DEFAULT_SOURCE)
  ASSERT(s->st_atim.tv_sec == t.st_atim.tv_sec);
  ASSERT(s->st_atim.tv_nsec == t.st_atim.tv_nsec);
  ASSERT(s->st_mtim.tv_sec == t.st_mtim.tv_sec);
  ASSERT(s->st_mtim.tv_nsec == t.st_mtim.tv_nsec);
  ASSERT(s->st_ctim.tv_sec == t.st_ctim.tv_sec);
  ASSERT(s->st_ctim.tv_nsec == t.st_ctim.tv_nsec);
# if defined(__FreeBSD__)    || \
     defined(__NetBSD__)
  ASSERT(s->st_birthtim.tv_sec == t.st_birthtim.tv_sec);
  ASSERT(s->st_birthtim.tv_nsec == t.st_birthtim.tv_nsec);
# endif
#else
  ASSERT(s->st_atim.tv_sec == t.st_atime);
  ASSERT(s->st_atim.tv_nsec == 0);
  ASSERT(s->st_mtim.tv_sec == t.st_mtime);
  ASSERT(s->st_mtim.tv_nsec == 0);
  ASSERT(s->st_ctim.tv_sec == t.st_ctime);
  ASSERT(s->st_ctim.tv_nsec == 0);
#endif
#endif

#if defined(__APPLE__) || defined(__FreeBSD__) || defined(__NetBSD__)
  ASSERT(s->st_flags == t.st_flags);
  ASSERT(s->st_gen == t.st_gen);
#else
  ASSERT(s->st_flags == 0);
  ASSERT(s->st_gen == 0);
#endif

  uv_fs_req_cleanup(&req);

  /* Now do the uv_fs_fstat call asynchronously */
  r = uv_fs_fstat(loop, &req, file, fstat_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(fstat_cb_count == 1);


  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
}